

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

void __thiscall
Synthesizer::Voice::NoteOn(Voice *this,int note,int velocity,float *p,float sampletime)

{
  uint uVar1;
  float fVar2;
  int local_28;
  int i;
  float sampletime_local;
  float *p_local;
  int velocity_local;
  int note_local;
  Voice *this_local;
  
  this->aenv = 1.0;
  this->aenvdecay = 1.0;
  this->fenv = 1.0;
  fVar2 = powf(0.0001,sampletime / p[4]);
  this->fenvdecay = fVar2;
  this->amp = (float)velocity * 0.007874016;
  this->rampcount = 0;
  VoiceChannel::Reset(this->channels);
  VoiceChannel::Reset(this->channels + 1);
  this->p = p;
  this->sampletime = sampletime;
  this->note = (float)note;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    uVar1 = Random::Get(&this->random);
    this->channels[0].phase[local_28] = uVar1;
    uVar1 = Random::Get(&this->random);
    this->channels[1].phase[local_28] = uVar1;
  }
  return;
}

Assistant:

void NoteOn(int note, int velocity, float* p, float sampletime)
        {
            aenv = 1.0f;
            aenvdecay = 1.0f;
            fenv = 1.0f;
            fenvdecay = powf(0.0001f, sampletime / p[P_DECAY]);
            amp = velocity * ONE_OVER_127;
            rampcount = 0;
            channels[0].Reset();
            channels[1].Reset();
            this->p = p;
            this->sampletime = sampletime;
            this->note = note;
            for (int i = 0; i < MAXOSCILLATORS; i++)
            {
                channels[0].phase[i] = random.Get();
                channels[1].phase[i] = random.Get();
            }
        }